

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::ForceManager::calcForces(ForceManager *this)

{
  if (this->initialized_ == false) {
    initialize(this);
  }
  (*this->_vptr_ForceManager[5])(this);
  (*this->_vptr_ForceManager[6])(this);
  if ((this->info_->simParams_->SkipPairLoop).super_ParameterBase.field_0x2b == '\0') {
    (*this->_vptr_ForceManager[7])(this);
  }
  (*this->_vptr_ForceManager[8])(this);
  return;
}

Assistant:

void ForceManager::calcForces() {
    if (!initialized_) initialize();

    preCalculation();
    shortRangeInteractions();
    if (info_->getSimParams()->getSkipPairLoop() == false)
      longRangeInteractions();
    postCalculation();
  }